

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

bool RSAVerifySignature(RSA *rsa,uchar *MsgHash,size_t MsgHashLen,char *Msg,size_t MsgLen,
                       bool *Authentic)

{
  int iVar1;
  EVP_PKEY *pkey;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  int AuthStatus;
  EVP_MD_CTX *m_RSAVerifyCtx;
  EVP_PKEY *pubKey;
  bool *Authentic_local;
  size_t MsgLen_local;
  char *Msg_local;
  size_t MsgHashLen_local;
  uchar *MsgHash_local;
  RSA *rsa_local;
  
  *Authentic = false;
  pkey = EVP_PKEY_new();
  EVP_PKEY_assign(pkey,6,rsa);
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  type = EVP_sha256();
  iVar1 = EVP_DigestVerifyInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
  if (iVar1 < 1) {
    EVP_PKEY_free(pkey);
    rsa_local._7_1_ = false;
  }
  else {
    iVar1 = EVP_DigestVerifyUpdate(ctx,Msg,MsgLen);
    if (iVar1 < 1) {
      EVP_PKEY_free(pkey);
      rsa_local._7_1_ = false;
    }
    else {
      iVar1 = EVP_DigestVerifyFinal(ctx,MsgHash,MsgHashLen);
      if (iVar1 == 1) {
        *Authentic = true;
        EVP_PKEY_free(pkey);
        EVP_MD_CTX_free(ctx);
        rsa_local._7_1_ = true;
      }
      else if (iVar1 == 0) {
        *Authentic = false;
        EVP_PKEY_free(pkey);
        EVP_MD_CTX_free(ctx);
        rsa_local._7_1_ = true;
      }
      else {
        *Authentic = false;
        EVP_PKEY_free(pkey);
        EVP_MD_CTX_free(ctx);
        rsa_local._7_1_ = false;
      }
    }
  }
  return rsa_local._7_1_;
}

Assistant:

bool RSAVerifySignature( RSA* rsa,
                         unsigned char* MsgHash,
                         size_t MsgHashLen,
                         const char* Msg,
                         size_t MsgLen,
                         bool* Authentic) {
  *Authentic = false;
  EVP_PKEY* pubKey  = EVP_PKEY_new();
  EVP_PKEY_assign_RSA(pubKey, rsa);
  EVP_MD_CTX* m_RSAVerifyCtx = EVP_MD_CTX_create();

  if (EVP_DigestVerifyInit(m_RSAVerifyCtx,
                           NULL,
                           EVP_sha256(),
                           NULL,
                           pubKey)<=0)
  {
    EVP_PKEY_free(pubKey);
    return false;
  }
  if (EVP_DigestVerifyUpdate(m_RSAVerifyCtx,
                             Msg,
                             MsgLen) <= 0)
  {
    EVP_PKEY_free(pubKey);
    return false;
  }
  int AuthStatus = EVP_DigestVerifyFinal(m_RSAVerifyCtx,
                                         MsgHash,
                                         MsgHashLen);
  if (AuthStatus==1) {
    *Authentic = true;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return true;
  } else if(AuthStatus==0){
    *Authentic = false;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return true;
  } else{
    *Authentic = false;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return false;
  }
}